

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# light.c
# Opt level: O2

void del_light_source(level *lev,int type,void *id)

{
  ls_t *__ptr;
  void *pvVar1;
  ls_t *plVar2;
  ls_t *plVar3;
  void *pvVar4;
  long lStack_10;
  
  if (type == 0) {
    lStack_10 = 0x18;
  }
  else {
    if (type != 1) {
      pvVar1 = (void *)0x0;
      goto LAB_001ac1fd;
    }
    lStack_10 = 0x28;
  }
  pvVar1 = (void *)(ulong)*(uint *)((long)id + lStack_10);
LAB_001ac1fd:
  __ptr = (ls_t *)&lev->lev_lights;
  plVar2 = (ls_t *)0x0;
  do {
    do {
      plVar3 = plVar2;
      __ptr = __ptr->next;
      if (__ptr == (ls_t *)0x0) {
        return;
      }
      plVar2 = __ptr;
    } while (__ptr->type != type);
    pvVar4 = pvVar1;
    if ((__ptr->flags & 2) == 0) {
      pvVar4 = id;
    }
  } while (__ptr->id != pvVar4);
  plVar2 = (ls_t *)&lev->lev_lights;
  if (plVar3 != (ls_t *)0x0) {
    plVar2 = plVar3;
  }
  plVar2->next = __ptr->next;
  free(__ptr);
  vision_full_recalc = '\x01';
  return;
}

Assistant:

void del_light_source(struct level *lev, int type, void *id)
{
    light_source *curr, *prev;
    long tmp_id;

    /* need to be prepared for dealing a with light source which
       has only been partially restored during a level change
       (in particular: chameleon vs prot. from shape changers) */
    switch (type) {
    case LS_OBJECT:	tmp_id = (((struct obj *)id)->o_id);
			break;
    case LS_MONSTER:	tmp_id = (((struct monst *)id)->m_id);
			break;
    default:		tmp_id = 0;
			break;
    }

    for (prev = 0, curr = lev->lev_lights; curr; prev = curr, curr = curr->next) {
	if (curr->type != type) continue;
	if (curr->id == ((curr->flags & LSF_NEEDS_FIXUP) ? (void*)tmp_id : id)) {
	    if (prev)
		prev->next = curr->next;
	    else
		lev->lev_lights = curr->next;

	    free(curr);
	    vision_full_recalc = 1;
	    return;
	}
    }
}